

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O3

void __thiscall
slang::IntervalMap<int,_int,_0U>::iterator::eraseNode
          (iterator *this,uint32_t level,allocator_type *alloc)

{
  uint uVar1;
  uint32_t uVar2;
  FreeNode *pFVar3;
  IntervalMap<int,_int,_0U> *__s;
  uint32_t end;
  uint uVar4;
  ulong uVar5;
  pointer pEVar6;
  uint level_00;
  
  level_00 = level - 1;
  if (level_00 == 0) {
    __s = (this->super_const_iterator).map;
    pEVar6 = (this->super_const_iterator).path.path.
             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
    uVar4 = pEVar6->offset;
    uVar2 = __s->rootSize;
    if (uVar2 != uVar4 + 1) {
      do {
        uVar5 = (ulong)uVar4;
        uVar4 = uVar4 + 1;
        *(undefined8 *)((long)&__s->field_0 + uVar5 * 8) =
             *(undefined8 *)((long)&__s->field_0 + (ulong)uVar4 * 8);
        *(undefined8 *)((long)&__s->field_0 + uVar5 * 8 + 0x60) =
             *(undefined8 *)((long)&__s->field_0 + (ulong)uVar4 * 8 + 0x60);
      } while (uVar2 - 1 != uVar4);
      pEVar6 = (this->super_const_iterator).path.path.
               super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
      uVar4 = __s->rootSize - 1;
    }
    __s->rootSize = uVar4;
    pEVar6->size = uVar4;
    if (uVar4 == 0) {
      memset(__s,0,0xc4);
      const_iterator::setRoot(&this->super_const_iterator,0);
      return;
    }
  }
  else {
    pEVar6 = (this->super_const_iterator).path.path.
             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
    pFVar3 = (FreeNode *)pEVar6[level_00].node;
    uVar2 = pEVar6[level_00].size;
    if (uVar2 == 1) {
      pFVar3->next = alloc->freeList;
      alloc->freeList = pFVar3;
      eraseNode(this,level_00,alloc);
    }
    else {
      if (uVar2 != pEVar6[level_00].offset + 1) {
        uVar4 = pEVar6[level_00].offset;
        do {
          uVar1 = uVar4 + 1;
          pFVar3[uVar4].next = pFVar3[uVar1].next;
          pFVar3[(ulong)uVar4 + 0xc].next = pFVar3[(ulong)uVar1 + 0xc].next;
          uVar4 = uVar1;
        } while (uVar2 - 1 != uVar1);
        pEVar6 = (this->super_const_iterator).path.path.
                 super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
      }
      pEVar6[level_00].size = uVar2 - 1;
      *(ulong *)((long)pEVar6[level - 2].node + (ulong)pEVar6[level - 2].offset * 8) =
           *(ulong *)((long)pEVar6[level - 2].node + (ulong)pEVar6[level - 2].offset * 8) &
           0xffffffffffffffc0 | (ulong)(uVar2 - 2);
      recomputeBounds(this,level_00);
    }
  }
  if (((this->super_const_iterator).path.path.
       super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len != 0) &&
     (pEVar6 = (this->super_const_iterator).path.path.
               super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_,
     pEVar6->offset < pEVar6->size)) {
    uVar5 = *(ulong *)((long)pEVar6[level_00].node + (ulong)pEVar6[level_00].offset * 8);
    pEVar6[level].node = (void *)(uVar5 & 0xffffffffffffffc0);
    pEVar6[level].size = ((uint)uVar5 & 0x3f) + 1;
    (this->super_const_iterator).path.path.
    super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_[level].offset = 0;
  }
  return;
}

Assistant:

void IntervalMap<TKey, TValue, N>::iterator::eraseNode(uint32_t level, allocator_type& alloc) {
    SLANG_ASSERT(level > 0);
    auto& map = *this->map;
    auto& path = this->path;

    if (--level == 0) {
        uint32_t offset = path.offset(0);
        map.rootBranch.erase(offset, offset + 1, map.rootSize);
        path.setSize(0, --map.rootSize);
        if (map.empty()) {
            map.switchToLeaf();
            this->setRoot(0);
            return;
        }
    }
    else {
        auto& parent = path.template node<Branch>(level);
        if (path.size(level) == 1) {
            // Branch node became empty, remove it recursively.
            alloc.destroy(&parent);
            eraseNode(level, alloc);
        }
        else {
            // N.B. see note about updating parent bounds in erase()
            uint32_t offset = path.offset(level);
            uint32_t size = path.size(level);
            parent.erase(offset, offset + 1, size);
            path.setSize(level, size - 1);
            recomputeBounds(level);
        }
    }

    if (path.valid()) {
        path.reset(level + 1);
        path.offset(level + 1) = 0;
    }
}